

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O1

ostream * operator<<(ostream *out,Vector *w)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
  poVar1 = std::ostream::_M_insert<double>(w->x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>(w->y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>(w->z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Vector& w) {
      out << "[" << w.x << ", " << w.y << ", " << w.z << "]";
      return out;
   }